

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lights.cpp
# Opt level: O2

string * __thiscall
pbrt::ImageInfiniteLight::ToString_abi_cxx11_
          (string *__return_storage_ptr__,ImageInfiniteLight *this)

{
  float *in_R8;
  string sStack_38;
  
  LightBase::BaseToString_abi_cxx11_(&sStack_38,&this->super_LightBase);
  StringPrintf<std::__cxx11::string,float_const&>
            (__return_storage_ptr__,(pbrt *)"[ ImageInfiniteLight %s scale: %f ]",(char *)&sStack_38
             ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&this->scale,
             in_R8);
  std::__cxx11::string::~string((string *)&sStack_38);
  return __return_storage_ptr__;
}

Assistant:

std::string ImageInfiniteLight::ToString() const {
    return StringPrintf("[ ImageInfiniteLight %s scale: %f ]", BaseToString(), scale);
}